

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int loadMem(char *filename,char **mem,int *size)

{
  uint uVar1;
  int iVar2;
  char *__ptr;
  ssize_t sVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  stat info;
  stat64 local_c0;
  
  iVar2 = stat64(filename,&local_c0);
  iVar4 = -1;
  if ((-1 < iVar2) && (__ptr = (char *)malloc(local_c0.st_size + 1), __ptr != (char *)0x0)) {
    iVar2 = open64(filename,0);
    uVar1 = 0;
    if (iVar2 < 0) {
      free(__ptr);
    }
    else {
      do {
        uVar6 = uVar1;
        uVar5 = (ulong)uVar6;
        sVar3 = read(iVar2,__ptr + uVar5,local_c0.st_size - uVar5);
        uVar1 = uVar6 + (int)sVar3;
      } while (0 < (int)sVar3);
      close(iVar2);
      if (local_c0.st_size == uVar5) {
        __ptr[uVar5] = '\0';
        *mem = __ptr;
        *size = uVar6;
        iVar4 = 0;
      }
      else {
        free(__ptr);
        iVar4 = -1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int loadMem(const char *filename, const char **mem, int *size) {
    int fd, res;
    struct stat info;
    char *base;
    int siz = 0;
    if (stat(filename, &info) < 0)
	return(-1);
    base = malloc(info.st_size + 1);
    if (base == NULL)
	return(-1);
    fd = open(filename, RD_FLAGS);
    if (fd  < 0) {
        free(base);
	return(-1);
    }
    while ((res = read(fd, &base[siz], info.st_size - siz)) > 0) {
        siz += res;
    }
    close(fd);
#if !defined(_WIN32)
    if (siz != info.st_size) {
        free(base);
	return(-1);
    }
#endif
    base[siz] = 0;
    *mem = base;
    *size = siz;
    return(0);
}